

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

uint64_t __thiscall jessilib::text_hashi::hash<char>(text_hashi *this,char *data,char *end)

{
  uint uVar1;
  char *extraout_RDX;
  ulong uVar2;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  decode_result dVar3;
  
  uVar2 = 0xcbf29ce484222325;
  if (this != (text_hashi *)data) {
    do {
      in_string._M_str = end;
      in_string._M_len = (size_t)this;
      dVar3 = decode_codepoint_utf8<char>((jessilib *)(data + -(long)this),in_string);
      if (dVar3.units == 0) {
        return uVar2;
      }
      uVar1 = jessilib::fold(dVar3.codepoint);
      uVar2 = (uVar2 ^ uVar1) * 0x100000001b3;
      this = this + dVar3.units;
      end = extraout_RDX;
    } while (this != (text_hashi *)data);
  }
  return uVar2;
}

Assistant:

static uint64_t hash(const CharT* data, const CharT* end) {
		uint64_t hash = 14695981039346656037ULL;

		decode_result decode;
		while (data != end) {
			decode = decode_codepoint(data, end - data);
			if (decode.units == 0) {
				return hash;
			}

			hash = hash ^ fold(decode.codepoint);
			hash = hash * 1099511628211ULL;
			data += decode.units;
		}

		return hash;
	}